

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

void arkInterpFree_Hermite(ARKodeMem_conflict ark_mem,ARKInterp interp)

{
  void *__ptr;
  
  if (interp != (ARKInterp)0x0) {
    __ptr = interp->content;
    if (__ptr != (void *)0x0) {
      if (*(long *)((long)__ptr + 8) != 0) {
        arkFreeVec(ark_mem,(N_Vector *)((long)__ptr + 8));
        __ptr = interp->content;
        *(undefined8 *)((long)__ptr + 8) = 0;
      }
      if (*(long *)((long)__ptr + 0x10) != 0) {
        arkFreeVec(ark_mem,(N_Vector *)((long)__ptr + 0x10));
        __ptr = interp->content;
        *(undefined8 *)((long)__ptr + 0x10) = 0;
      }
      if (*(long *)((long)__ptr + 0x18) != 0) {
        arkFreeVec(ark_mem,(N_Vector *)((long)__ptr + 0x18));
        __ptr = interp->content;
        *(undefined8 *)((long)__ptr + 0x18) = 0;
      }
      if (*(long *)((long)__ptr + 0x20) != 0) {
        arkFreeVec(ark_mem,(N_Vector *)((long)__ptr + 0x20));
        __ptr = interp->content;
        *(undefined8 *)((long)__ptr + 0x20) = 0;
      }
      ark_mem->lrw = ark_mem->lrw + -2;
      ark_mem->liw = ark_mem->liw + -5;
      free(__ptr);
      interp->content = (void *)0x0;
    }
    if (interp->ops != (ARKInterpOps)0x0) {
      free(interp->ops);
    }
    free(interp);
    return;
  }
  return;
}

Assistant:

void arkInterpFree_Hermite(ARKodeMem ark_mem, ARKInterp interp)
{
  /* if interpolation structure is NULL, just return */
  if (interp == NULL) { return; }

  /* free content */
  if (interp->content != NULL)
  {
    if (HINT_FOLD(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_FOLD(interp)));
      HINT_FOLD(interp) = NULL;
    }
    if (HINT_YOLD(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_YOLD(interp)));
      HINT_YOLD(interp) = NULL;
    }
    if (HINT_FA(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_FA(interp)));
      HINT_FA(interp) = NULL;
    }
    if (HINT_FB(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_FB(interp)));
      HINT_FB(interp) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= 2;
    ark_mem->liw -= 5;

    free(interp->content);
    interp->content = NULL;
  }

  /* free ops and interpolation structures */
  if (interp->ops)
  {
    free(interp->ops);
    interp->ops = NULL;
  }
  free(interp);
  interp = NULL;

  return;
}